

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCanon.c
# Opt level: O2

void Aig_RManRecord(uint *pTruth,int nVarsInit)

{
  uint *__src;
  Kit_DsdObj_t KVar1;
  Aig_RMan_t *pAVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Kit_DsdNtk_t *pNtk;
  Kit_DsdObj_t *pKVar6;
  ulong uVar7;
  uint nVars;
  void *__src_00;
  char *pcVar9;
  uint iVar;
  ulong uVar8;
  
  if (0xc < nVarsInit) {
    pcVar9 = "The number of variables in too large.";
LAB_0056cbf8:
    puts(pcVar9);
    return;
  }
  if (s_pRMan == (Aig_RMan_t *)0x0) {
    s_pRMan = Aig_RManStart();
  }
  s_pRMan->nTotal = s_pRMan->nTotal + 1;
  pNtk = Kit_DsdDecompose(pTruth,nVarsInit);
  pKVar6 = Kit_DsdNonDsdPrimeMax(pNtk);
  pAVar2 = s_pRMan;
  if (pKVar6 != (Kit_DsdObj_t *)0x0) {
    KVar1 = *pKVar6;
    nVars = (uint)KVar1 >> 0x1a;
    uVar8 = (ulong)nVars;
    if (nVars != 3) {
      s_pRMan->nVarFuncs[uVar8] = s_pRMan->nVarFuncs[uVar8] + 1;
      if ((int)nVars < nVarsInit) {
        pAVar2->nTtDsdPart = pAVar2->nTtDsdPart + 1;
      }
      else {
        pAVar2->nTtDsdNot = pAVar2->nTtDsdNot + 1;
      }
      uVar3 = 1 << ((KVar1._3_1_ >> 2) - 5 & 0x1f);
      if ((uint)KVar1 < 0x18000000) {
        uVar3 = 1;
      }
      __src_00 = (void *)0x0;
      if (((uint)*pKVar6 & 0x1c0) == 0x140) {
        __src_00 = &pKVar6[1].field_0x0 + ((uint)*pKVar6 >> 8 & 0x3fc);
      }
      memcpy(pAVar2->pTruthInit,__src_00,(long)(int)(uVar3 * 4));
      Kit_DsdNtkFree(pNtk);
      pAVar2 = s_pRMan;
      __src = s_pRMan->pTruthInit;
      if ((s_pRMan->pTruthInit[0] & 1) != 0) {
        for (uVar7 = (ulong)uVar3; 0 < (int)uVar7; uVar7 = uVar7 - 1) {
          pAVar2->pTruthInit[uVar7 - 1] = ~pAVar2->pTruthInit[uVar7 - 1];
        }
      }
      memcpy(pAVar2->pTruth,__src,(long)(int)(uVar3 * 4));
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pAVar2->pPerm[uVar7] = (char)uVar7;
      }
      uVar3 = Aig_RManSemiCanonicize
                        (pAVar2->pTruthTemp,pAVar2->pTruth,nVars,pAVar2->pPerm,pAVar2->pMints,1);
      pAVar2 = s_pRMan;
      iVar4 = Aig_RManVarsAreUnique(s_pRMan->pMints,nVars);
      pAVar2->nUniqueVars = pAVar2->nUniqueVars + iVar4;
      iVar5 = Aig_RManTableFindOrAdd(pAVar2,pAVar2->pTruth,nVars);
      if (iVar5 != 0) {
        Aig_RManSaveOne(s_pRMan,s_pRMan->pTruth,nVars);
      }
      pAVar2 = s_pRMan;
      pcVar9 = s_pRMan->pPermR;
      for (uVar7 = 0; uVar8 != uVar7; uVar7 = uVar7 + 1) {
        pAVar2->pPermR[uVar7] = pAVar2->pPerm[uVar7];
      }
      Kit_TruthPermute(pAVar2->pTruthTemp,pAVar2->pTruth,nVars,pcVar9,1);
      for (iVar = 0; nVars != iVar; iVar = iVar + 1) {
        if ((uVar3 >> (iVar & 0x1f) & 1) != 0) {
          Kit_TruthChangePhase(s_pRMan->pTruth,nVars,iVar);
        }
      }
      if (iVar4 != 0) {
        iVar4 = Kit_TruthIsEqual(s_pRMan->pTruth,s_pRMan->pTruthInit,nVars);
        if (iVar4 == 0) {
          pcVar9 = "Verification failed.";
          goto LAB_0056cbf8;
        }
      }
      return;
    }
  }
  s_pRMan->nTtDsd = s_pRMan->nTtDsd + 1;
  Kit_DsdNtkFree(pNtk);
  return;
}

Assistant:

void Aig_RManRecord( unsigned * pTruth, int nVarsInit )
{
    int fVerify = 1;
    Kit_DsdNtk_t * pNtk;
    Kit_DsdObj_t * pObj;
    unsigned uPhaseC;
    int i, nVars, nWords;
    int fUniqueVars;

    if ( nVarsInit > RMAN_MAXVARS )
    {
        printf( "The number of variables in too large.\n" );
        return;
    }

    if ( s_pRMan == NULL )
        s_pRMan = Aig_RManStart();
    s_pRMan->nTotal++;
    // canonicize the function
    pNtk = Kit_DsdDecompose( pTruth, nVarsInit );
    pObj = Kit_DsdNonDsdPrimeMax( pNtk );
    if ( pObj == NULL || pObj->nFans == 3 )
    {
        s_pRMan->nTtDsd++;
        Kit_DsdNtkFree( pNtk );
        return;
    }
    nVars = pObj->nFans;
    s_pRMan->nVarFuncs[nVars]++;
    if ( nVars < nVarsInit )
        s_pRMan->nTtDsdPart++;
    else
        s_pRMan->nTtDsdNot++;
    // compute the number of words
    nWords = Abc_TruthWordNum( nVars );
    // copy the function
    memcpy( s_pRMan->pTruthInit, Kit_DsdObjTruth(pObj), (size_t)(4*nWords) );
    Kit_DsdNtkFree( pNtk );
    // canonicize the output
    if ( s_pRMan->pTruthInit[0] & 1 )
        Kit_TruthNot( s_pRMan->pTruthInit, s_pRMan->pTruthInit, nVars );
    memcpy( s_pRMan->pTruth, s_pRMan->pTruthInit, 4*nWords );

    // canonize the function
    for ( i = 0; i < nVars; i++ )
        s_pRMan->pPerm[i] = i;
    uPhaseC = Aig_RManSemiCanonicize( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPerm, s_pRMan->pMints, 1 );
    // check unique variables
    fUniqueVars = Aig_RManVarsAreUnique( s_pRMan->pMints, nVars );
    s_pRMan->nUniqueVars += fUniqueVars;

/*
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    Extra_PrintBinary( stdout, &uPhaseC, nVars );
    printf( "  " );
    for ( i = 0; i < nVars; i++ )
        printf( "%2d/%2d ", s_pRMan->pMints[2*i], s_pRMan->pMints[2*i+1] );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );
*/
/*
    printf( "\n" );
    printf( "%4d : ", s_pRMan->nTotal );
    printf( "%2d %2d  ", nVarsInit, nVars );
    printf( "   " );
    printf( "\n" );
    Aig_RManPrintUniqueVars( s_pRMan->pMints, nVars );
//    Aig_RManPrintSigs( s_pRMan->pMints, nVars );
*/

//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n\n" );

    if ( Aig_RManTableFindOrAdd( s_pRMan, s_pRMan->pTruth, nVars ) )
        Aig_RManSaveOne( s_pRMan, s_pRMan->pTruth, nVars );

    if ( fVerify )
    {
        // derive reverse permutation
        for ( i = 0; i < nVars; i++ )
            s_pRMan->pPermR[i] = s_pRMan->pPerm[i];
        // implement permutation
        Kit_TruthPermute( s_pRMan->pTruthTemp, s_pRMan->pTruth, nVars, s_pRMan->pPermR, 1 );
        // implement polarity
        for ( i = 0; i < nVars; i++ )
            if ( uPhaseC & (1 << i) )
                Kit_TruthChangePhase( s_pRMan->pTruth, nVars, i );

        // perform verification
        if ( fUniqueVars && !Kit_TruthIsEqual( s_pRMan->pTruth, s_pRMan->pTruthInit, nVars ) )
            printf( "Verification failed.\n" );
    }
//Aig_RManPrintVarProfile( s_pRMan->pTruth, nVars, s_pRMan->pTruthTemp );
//Extra_PrintBinary( stdout, s_pRMan->pTruth, 1<<nVars ); printf( "\n" );
}